

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O3

void __thiscall OpenMD::RNEMD::RNEMD::doRNEMD(RNEMD *this)

{
  undefined8 *puVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  pointer ppSVar5;
  pointer ppSVar6;
  pointer ppBVar7;
  pointer ppBVar8;
  pointer ppBVar9;
  pointer ppBVar10;
  pointer ppTVar11;
  pointer ppTVar12;
  pointer ppIVar13;
  pointer ppIVar14;
  pointer ppMVar15;
  pointer ppMVar16;
  RealType RVar17;
  undefined8 uVar18;
  uint i;
  long lVar19;
  SelectionManager reducedCommonA;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  SelectionManager reducedCommonB;
  SelectionManager reducedTempCommonB;
  SelectionManager reducedTempCommonA;
  SelectionManager local_4f8;
  SelectionManager local_428;
  SelectionManager local_358;
  SelectionManager local_288;
  SelectionManager local_1b8;
  SelectionManager local_f0;
  
  if (this->doRNEMD_ == true) {
    this->trialCount_ = this->trialCount_ + 1;
    Snapshot::getHmat((Mat3x3d *)&local_4f8,this->currentSnap_);
    if ((SelectionManager *)&this->hmat_ != &local_4f8) {
      lVar19 = 0;
      do {
        *(undefined8 *)
         ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                [0] + lVar19 + 0x10) =
             *(undefined8 *)
              ((long)&local_4f8.ss_.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_finish + lVar19);
        uVar18 = *(undefined8 *)
                  ((long)&local_4f8.ss_.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar19);
        puVar1 = (undefined8 *)
                 ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                        .data_[0] + lVar19);
        *puVar1 = *(undefined8 *)((long)&local_4f8.info_ + lVar19);
        puVar1[1] = uVar18;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x48);
    }
    SelectionEvaluator::loadScriptString(&this->evaluator_,&this->rnemdObjectSelection_);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_4f8,&this->evaluator_);
      lVar19 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar19)
                   ,(vector<bool,_std::allocator<bool>_> *)
                    ((long)&(local_4f8.info_)->_vptr_SimInfo + lVar19));
        lVar19 = lVar19 + 0x28;
      } while (lVar19 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_4f8);
    }
    SelectionEvaluator::loadScriptString(&this->evaluatorA_,&this->selectionA_);
    if ((this->evaluatorA_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_4f8,&this->evaluatorA_);
      lVar19 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleManA_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar19)
                   ,(vector<bool,_std::allocator<bool>_> *)
                    ((long)&(local_4f8.info_)->_vptr_SimInfo + lVar19));
        lVar19 = lVar19 + 0x28;
      } while (lVar19 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_4f8);
    }
    SelectionEvaluator::loadScriptString(&this->evaluatorB_,&this->selectionB_);
    if ((this->evaluatorB_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_4f8,&this->evaluatorB_);
      lVar19 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleManB_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar19)
                   ,(vector<bool,_std::allocator<bool>_> *)
                    ((long)&(local_4f8.info_)->_vptr_SimInfo + lVar19));
        lVar19 = lVar19 + 0x28;
      } while (lVar19 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_4f8);
    }
    operator&(&local_4f8,&this->seleManA_,&this->seleMan_);
    local_288.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->commonA_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_288.info_ =
         (SimInfo *)
         (this->commonA_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_288.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->commonA_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).info_ = local_4f8.info_;
    (this->commonA_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonA_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_288);
    piVar3 = (this->commonA_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->commonA_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonA_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    ppSVar5 = (this->commonA_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar6 = (this->commonA_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonA_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar5 != (pointer)0x0) {
      operator_delete(ppSVar5,(long)ppSVar6 - (long)ppSVar5);
    }
    ppBVar7 = (this->commonA_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar8 = (this->commonA_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->commonA_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->commonA_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar7 != (pointer)0x0) {
      operator_delete(ppBVar7,(long)ppBVar8 - (long)ppBVar7);
    }
    ppBVar9 = (this->commonA_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar10 = (this->commonA_).bends_.
               super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->commonA_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->commonA_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar9 != (pointer)0x0) {
      operator_delete(ppBVar9,(long)ppBVar10 - (long)ppBVar9);
    }
    ppTVar11 = (this->commonA_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar12 = (this->commonA_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonA_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppTVar11 != (pointer)0x0) {
      operator_delete(ppTVar11,(long)ppTVar12 - (long)ppTVar11);
    }
    ppIVar13 = (this->commonA_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar14 = (this->commonA_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonA_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar13 != (pointer)0x0) {
      operator_delete(ppIVar13,(long)ppIVar14 - (long)ppIVar13);
    }
    ppMVar15 = (this->commonA_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppMVar16 = (this->commonA_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->commonA_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonA_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonA_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppMVar15 != (pointer)0x0) {
      operator_delete(ppMVar15,(long)ppMVar16 - (long)ppMVar15);
    }
    SelectionManager::~SelectionManager(&local_4f8);
    operator&(&local_4f8,&this->seleManB_,&this->seleMan_);
    local_288.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (this->commonB_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_288.info_ =
         (SimInfo *)
         (this->commonB_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_288.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         (this->commonB_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).info_ = local_4f8.info_;
    (this->commonB_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonB_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_288);
    piVar3 = (this->commonB_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->commonB_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonB_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (piVar3 != (pointer)0x0) {
      operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    }
    ppSVar5 = (this->commonB_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar6 = (this->commonB_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonB_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar5 != (pointer)0x0) {
      operator_delete(ppSVar5,(long)ppSVar6 - (long)ppSVar5);
    }
    ppBVar7 = (this->commonB_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar8 = (this->commonB_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->commonB_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->commonB_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar7 != (pointer)0x0) {
      operator_delete(ppBVar7,(long)ppBVar8 - (long)ppBVar7);
    }
    ppBVar9 = (this->commonB_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar10 = (this->commonB_).bends_.
               super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->commonB_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->commonB_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar9 != (pointer)0x0) {
      operator_delete(ppBVar9,(long)ppBVar10 - (long)ppBVar9);
    }
    ppTVar11 = (this->commonB_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar12 = (this->commonB_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonB_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppTVar11 != (pointer)0x0) {
      operator_delete(ppTVar11,(long)ppTVar12 - (long)ppTVar11);
    }
    ppIVar13 = (this->commonB_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar14 = (this->commonB_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonB_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar13 != (pointer)0x0) {
      operator_delete(ppIVar13,(long)ppIVar14 - (long)ppIVar13);
    }
    ppMVar15 = (this->commonB_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppMVar16 = (this->commonB_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->commonB_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4f8.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->commonB_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4f8.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->commonB_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4f8.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppMVar15 != (pointer)0x0) {
      operator_delete(ppMVar15,(long)ppMVar16 - (long)ppMVar15);
    }
    SelectionManager::~SelectionManager(&local_4f8);
    SelectionManager::removeAtomsInRigidBodies(&local_4f8,&this->commonA_);
    SelectionManager::removeAtomsInRigidBodies(&local_288,&this->commonB_);
    RVar17 = getDefaultDividingArea(this);
    dVar2 = this->exchangeTime_;
    this->kineticTarget_ = this->kineticFlux_ * dVar2 * RVar17;
    local_358.info_ = (SimInfo *)0x0;
    local_358.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = 0;
    do {
      (&local_358.info_)[lVar19] =
           (SimInfo *)((this->momentumFluxVector_).super_Vector<double,_3U>.data_[lVar19] * dVar2);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_428.info_ = (SimInfo *)0x0;
    local_428.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = 0;
    do {
      (&local_428.info_)[lVar19] = (SimInfo *)((double)(&local_358.info_)[lVar19] * RVar17);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    (this->momentumTarget_).super_Vector<double,_3U>.data_[2] =
         (double)local_428.ss_.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    (this->momentumTarget_).super_Vector<double,_3U>.data_[0] = (double)local_428.info_;
    (this->momentumTarget_).super_Vector<double,_3U>.data_[1] =
         (double)local_428.ss_.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    local_358.info_ = (SimInfo *)0x0;
    local_358.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = 0;
    do {
      (&local_358.info_)[lVar19] =
           (SimInfo *)
           ((this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[lVar19] * dVar2);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_428.info_ = (SimInfo *)0x0;
    local_428.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = 0;
    do {
      (&local_428.info_)[lVar19] = (SimInfo *)((double)(&local_358.info_)[lVar19] * RVar17);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    (this->angularMomentumTarget_).super_Vector<double,_3U>.data_[2] =
         (double)local_428.ss_.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    (this->angularMomentumTarget_).super_Vector<double,_3U>.data_[0] = (double)local_428.info_;
    (this->angularMomentumTarget_).super_Vector<double,_3U>.data_[1] =
         (double)local_428.ss_.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    dVar2 = RVar17 * dVar2 * this->particleFlux_;
    this->particleTarget_ = dVar2;
    if (1.0 < ABS(dVar2)) {
      snprintf(painCave.errMsg,2000,
               "RNEMD: The current particleFlux,\n\t\t%f\n\thas resulted in a target particle exchange of %f.\n\tThis is equivalent to moving more than one particle\n\tduring each exchange.  Please reduce your particleFlux.\n"
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    if (this->rnemdFluxType_ - rnemdParticle < 3) {
      operator&(&local_428,&this->seleManA_,&this->outputSeleMan_);
      operator&(&local_358,&this->seleManB_,&this->outputSeleMan_);
      SelectionManager::removeAtomsInRigidBodies(&local_f0,&local_428);
      SelectionManager::removeAtomsInRigidBodies(&local_1b8,&local_358);
      (*this->_vptr_RNEMD[2])(this,&local_f0,&local_1b8);
      SelectionManager::~SelectionManager(&local_1b8);
      SelectionManager::~SelectionManager(&local_f0);
      SelectionManager::~SelectionManager(&local_358);
      SelectionManager::~SelectionManager(&local_428);
    }
    else {
      (*this->_vptr_RNEMD[2])(this,&local_4f8,&local_288);
    }
    SelectionManager::~SelectionManager(&local_288);
    SelectionManager::~SelectionManager(&local_4f8);
  }
  return;
}

Assistant:

void RNEMD::doRNEMD() {
    if (!doRNEMD_) return;
    trialCount_++;
    hmat_ = currentSnap_->getHmat();

    // dynamic object evaluators:
    evaluator_.loadScriptString(rnemdObjectSelection_);
    if (evaluator_.isDynamic()) seleMan_.setSelectionSet(evaluator_.evaluate());

    evaluatorA_.loadScriptString(selectionA_);
    if (evaluatorA_.isDynamic())
      seleManA_.setSelectionSet(evaluatorA_.evaluate());

    evaluatorB_.loadScriptString(selectionB_);
    if (evaluatorB_.isDynamic())
      seleManB_.setSelectionSet(evaluatorB_.evaluate());

    commonA_ = seleManA_ & seleMan_;
    commonB_ = seleManB_ & seleMan_;

    auto reducedCommonA = commonA_.removeAtomsInRigidBodies();
    auto reducedCommonB = commonB_.removeAtomsInRigidBodies();

    // Target exchange quantities (in each exchange) = flux * dividingArea *
    // dt flux = target flux dividingArea = smallest dividing surface between
    // the two regions dt = exchange time interval

    RealType area = getDefaultDividingArea();

    kineticTarget_         = kineticFlux_ * exchangeTime_ * area;
    momentumTarget_        = momentumFluxVector_ * exchangeTime_ * area;
    angularMomentumTarget_ = angularMomentumFluxVector_ * exchangeTime_ * area;
    particleTarget_        = particleFlux_ * exchangeTime_ * area;

    if (std::fabs(particleTarget_) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current particleFlux,\n"
               "\t\t%f\n"
               "\thas resulted in a target particle exchange of %f.\n"
               "\tThis is equivalent to moving more than one particle\n"
               "\tduring each exchange.  Please reduce your particleFlux.\n",
               particleFlux_, particleTarget_);
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (rnemdFluxType_ == rnemdParticle || rnemdFluxType_ == rnemdParticleKE ||
        rnemdFluxType_ == rnemdCurrentDensity) {
      SelectionManager tempCommonA = seleManA_ & outputSeleMan_;
      SelectionManager tempCommonB = seleManB_ & outputSeleMan_;

      auto reducedTempCommonA = tempCommonA.removeAtomsInRigidBodies();
      auto reducedTempCommonB = tempCommonB.removeAtomsInRigidBodies();

      this->doRNEMDImpl(reducedTempCommonA, reducedTempCommonB);
    } else {
      this->doRNEMDImpl(reducedCommonA, reducedCommonB);
    }
  }